

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs3.c
# Opt level: O1

void logs3_report(logmath_t *logmath)

{
  uint32 shift;
  uint32 width;
  uint32 size;
  uint32 local_24;
  uint local_20;
  uint local_1c;
  
  if (logmath != (logmath_t *)0x0) {
    logmath_get_table_shape(logmath,&local_1c,&local_20,&local_24);
    err_msg(ERR_INFO,(char *)0x0,0,"Initialization of the log add table\n");
    err_msg(ERR_INFO,(char *)0x0,0,"Log-Add table size = %d x %d >> %d\n",(ulong)local_1c,
            (ulong)local_20,local_24);
    err_msg(ERR_INFO,(char *)0x0,0,"\n");
  }
  return;
}

Assistant:

void
logs3_report(logmath_t* logmath)
{
    if (logmath) {
	uint32 size, width, shift;

	logmath_get_table_shape(logmath, &size, &width, &shift);
	E_INFO_NOFN("Initialization of the log add table\n");
	E_INFO_NOFN("Log-Add table size = %d x %d >> %d\n", size, width, shift);
	E_INFO_NOFN("\n");
    }
}